

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Type_get_envelope
              (MPIABI_Datatype datatype,int *num_integers,int *num_addresses,int *num_datatypes,
              int *combiner)

{
  int iVar1;
  
  iVar1 = MPI_Type_get_envelope();
  return iVar1;
}

Assistant:

int MPIABI_Type_get_envelope(
  MPIABI_Datatype datatype,
  int * num_integers,
  int * num_addresses,
  int * num_datatypes,
  int * combiner
) {
  return MPI_Type_get_envelope(
    (MPI_Datatype)(WPI_Datatype)datatype,
    num_integers,
    num_addresses,
    num_datatypes,
    combiner
  );
}